

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryUint::test
          (ShaderBitfieldOperationCaseBinaryUint *this,Data *data)

{
  GLuint GVar1;
  long lVar2;
  GLuint expected2;
  GLuint local_2c;
  
  if (0 < this->m_components) {
    lVar2 = 0;
    do {
      local_2c = 0;
      GVar1 = (*this->m_func)(data->inUvec4[lVar2],data->in2Uvec4[lVar2],&local_2c);
      if ((data->outUvec4[lVar2] != GVar1) || (data->out2Uvec4[lVar2] != local_2c)) {
        return false;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->m_components);
  }
  return true;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected2 = 0;
			GLuint expected  = m_func(data->inUvec4[i], data->in2Uvec4[i], expected2);
			if (data->outUvec4[i] != expected || data->out2Uvec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}